

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void __thiscall
crnlib::dxt1_endpoint_optimizer::try_combinatorial_encoding(dxt1_endpoint_optimizer *this)

{
  uint *puVar1;
  ulong uVar2;
  uint uVar3;
  unique_color *puVar4;
  uint uVar5;
  unsigned_short *puVar6;
  results *prVar7;
  long lVar8;
  unique_color *a;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint i;
  long lVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  uint16 packed_color;
  uchar local_48;
  uchar uStack_47;
  uchar local_46;
  uchar uStack_45;
  uint local_44;
  results *local_40;
  long local_38;
  
  uVar9 = (this->m_unique_colors).m_size;
  if (0xfffffffc < uVar9 - 5) {
    prVar7 = (results *)&this->m_temp_unique_colors;
    if ((this->m_temp_unique_colors).m_capacity < uVar9) {
      if (((unique_color_vec *)prVar7)->m_p != (unique_color *)0x0) {
        crnlib_free(((unique_color_vec *)prVar7)->m_p);
        ((unique_color_vec *)prVar7)->m_p = (unique_color *)0x0;
        (this->m_temp_unique_colors).m_size = 0;
        (this->m_temp_unique_colors).m_capacity = 0;
      }
      elemental_vector::increase_capacity
                ((elemental_vector *)prVar7,(this->m_unique_colors).m_size,false,8,(object_mover)0x0
                 ,false);
    }
    else if ((this->m_temp_unique_colors).m_size != 0) {
      (this->m_temp_unique_colors).m_size = 0;
    }
    a = (this->m_unique_colors).m_p;
    memcpy((this->m_temp_unique_colors).m_p,a,(ulong)(this->m_unique_colors).m_size << 3);
    uVar3 = (this->m_unique_colors).m_size;
    (this->m_temp_unique_colors).m_size = uVar3;
    local_40 = prVar7;
    if (uVar3 == 2) {
      iVar10 = 0;
      do {
        lVar13 = 0;
        lVar15 = 0;
        do {
          puVar4 = (this->m_temp_unique_colors).m_p;
          uVar5 = (uint)lVar15 ^ 1;
          local_38 = lVar15;
          lerp_color((dxt1_endpoint_optimizer *)&stack0xffffffffffffffb8,&a->m_color,
                     (color_quad_u8 *)((long)&(puVar4->m_color).field_0 + lVar13),2.0,
                     (int)puVar4 + uVar5 * 8);
          uVar9 = (this->m_temp_unique_colors).m_size;
          a = (unique_color *)(ulong)uVar9;
          if ((this->m_temp_unique_colors).m_capacity <= uVar9) {
            a = (unique_color *)(ulong)(uVar9 + 1);
            elemental_vector::increase_capacity
                      ((elemental_vector *)prVar7,uVar9 + 1,true,8,(object_mover)0x0,false);
          }
          puVar4 = (this->m_temp_unique_colors).m_p;
          uVar9 = (this->m_temp_unique_colors).m_size;
          puVar4[uVar9].m_color.field_0.field_0.r = local_48;
          puVar4[uVar9].m_color.field_0.field_0.g = uStack_47;
          puVar4[uVar9].m_color.field_0.field_0.b = local_46;
          puVar4[uVar9].m_color.field_0.field_0.a = uStack_45;
          puVar4[uVar9].m_weight = local_44;
          uVar3 = (this->m_temp_unique_colors).m_size;
          uVar9 = uVar3 + 1;
          (this->m_temp_unique_colors).m_size = uVar9;
          puVar4 = (this->m_temp_unique_colors).m_p;
          lerp_color((dxt1_endpoint_optimizer *)&stack0xffffffffffffffb8,&a->m_color,
                     (color_quad_u8 *)((long)&(puVar4->m_color).field_0 + lVar13),3.0,
                     (int)puVar4 + uVar5 * 8);
          if ((this->m_temp_unique_colors).m_capacity <= uVar9) {
            uVar9 = uVar3 + 2;
            a = (unique_color *)(ulong)uVar9;
            elemental_vector::increase_capacity
                      ((elemental_vector *)local_40,uVar9,true,8,(object_mover)0x0,false);
          }
          puVar4 = (this->m_temp_unique_colors).m_p;
          uVar9 = (this->m_temp_unique_colors).m_size;
          puVar4[uVar9].m_color.field_0.field_0.r = local_48;
          puVar4[uVar9].m_color.field_0.field_0.g = uStack_47;
          puVar4[uVar9].m_color.field_0.field_0.b = local_46;
          puVar4[uVar9].m_color.field_0.field_0.a = uStack_45;
          puVar4[uVar9].m_weight = local_44;
          uVar3 = (this->m_temp_unique_colors).m_size;
          uVar9 = uVar3 + 1;
          (this->m_temp_unique_colors).m_size = uVar9;
          puVar4 = (this->m_temp_unique_colors).m_p;
          lerp_color((dxt1_endpoint_optimizer *)&stack0xffffffffffffffb8,&a->m_color,
                     (color_quad_u8 *)((long)&(puVar4->m_color).field_0 + lVar13),0.5,
                     (int)puVar4 + uVar5 * 8);
          if ((this->m_temp_unique_colors).m_capacity <= uVar9) {
            uVar9 = uVar3 + 2;
            a = (unique_color *)(ulong)uVar9;
            elemental_vector::increase_capacity
                      ((elemental_vector *)local_40,uVar9,true,8,(object_mover)0x0,false);
          }
          puVar4 = (this->m_temp_unique_colors).m_p;
          uVar9 = (this->m_temp_unique_colors).m_size;
          puVar4[uVar9].m_color.field_0.field_0.r = local_48;
          puVar4[uVar9].m_color.field_0.field_0.g = uStack_47;
          puVar4[uVar9].m_color.field_0.field_0.b = local_46;
          puVar4[uVar9].m_color.field_0.field_0.a = uStack_45;
          puVar4[uVar9].m_weight = local_44;
          uVar3 = (this->m_temp_unique_colors).m_size;
          uVar9 = uVar3 + 1;
          (this->m_temp_unique_colors).m_size = uVar9;
          puVar4 = (this->m_temp_unique_colors).m_p;
          lerp_color((dxt1_endpoint_optimizer *)&stack0xffffffffffffffb8,&a->m_color,
                     (color_quad_u8 *)((long)&(puVar4->m_color).field_0 + lVar13),1.5,
                     (int)puVar4 + uVar5 * 8);
          if ((this->m_temp_unique_colors).m_capacity <= uVar9) {
            uVar9 = uVar3 + 2;
            a = (unique_color *)(ulong)uVar9;
            elemental_vector::increase_capacity
                      ((elemental_vector *)local_40,uVar9,true,8,(object_mover)0x0,false);
          }
          puVar4 = (this->m_temp_unique_colors).m_p;
          uVar9 = (this->m_temp_unique_colors).m_size;
          puVar4[uVar9].m_color.field_0.field_0.r = local_48;
          puVar4[uVar9].m_color.field_0.field_0.g = uStack_47;
          puVar4[uVar9].m_color.field_0.field_0.b = local_46;
          puVar4[uVar9].m_color.field_0.field_0.a = uStack_45;
          puVar4[uVar9].m_weight = local_44;
          uVar3 = (this->m_temp_unique_colors).m_size;
          uVar9 = uVar3 + 1;
          (this->m_temp_unique_colors).m_size = uVar9;
          puVar4 = (this->m_temp_unique_colors).m_p;
          lerp_color((dxt1_endpoint_optimizer *)&stack0xffffffffffffffb8,&a->m_color,
                     (color_quad_u8 *)((long)&(puVar4->m_color).field_0 + lVar13),-1.0,
                     (int)puVar4 + uVar5 * 8);
          if ((this->m_temp_unique_colors).m_capacity <= uVar9) {
            uVar9 = uVar3 + 2;
            a = (unique_color *)(ulong)uVar9;
            elemental_vector::increase_capacity
                      ((elemental_vector *)local_40,uVar9,true,8,(object_mover)0x0,false);
          }
          puVar4 = (this->m_temp_unique_colors).m_p;
          uVar9 = (this->m_temp_unique_colors).m_size;
          puVar4[uVar9].m_color.field_0.field_0.r = local_48;
          puVar4[uVar9].m_color.field_0.field_0.g = uStack_47;
          puVar4[uVar9].m_color.field_0.field_0.b = local_46;
          puVar4[uVar9].m_color.field_0.field_0.a = uStack_45;
          puVar4[uVar9].m_weight = local_44;
          uVar3 = (this->m_temp_unique_colors).m_size;
          uVar9 = uVar3 + 1;
          (this->m_temp_unique_colors).m_size = uVar9;
          puVar4 = (this->m_temp_unique_colors).m_p;
          lerp_color((dxt1_endpoint_optimizer *)&stack0xffffffffffffffb8,&a->m_color,
                     (color_quad_u8 *)((long)&(puVar4->m_color).field_0 + lVar13),2.0,
                     (int)puVar4 + uVar5 * 8);
          if ((this->m_temp_unique_colors).m_capacity <= uVar9) {
            uVar9 = uVar3 + 2;
            a = (unique_color *)(ulong)uVar9;
            elemental_vector::increase_capacity
                      ((elemental_vector *)local_40,uVar9,true,8,(object_mover)0x0,false);
          }
          puVar4 = (this->m_temp_unique_colors).m_p;
          uVar9 = (this->m_temp_unique_colors).m_size;
          puVar4[uVar9].m_color.field_0.field_0.r = local_48;
          puVar4[uVar9].m_color.field_0.field_0.g = uStack_47;
          puVar4[uVar9].m_color.field_0.field_0.b = local_46;
          puVar4[uVar9].m_color.field_0.field_0.a = uStack_45;
          puVar4[uVar9].m_weight = local_44;
          uVar3 = (this->m_temp_unique_colors).m_size;
          uVar9 = uVar3 + 1;
          (this->m_temp_unique_colors).m_size = uVar9;
          puVar4 = (this->m_temp_unique_colors).m_p;
          lerp_color((dxt1_endpoint_optimizer *)&stack0xffffffffffffffb8,&a->m_color,
                     (color_quad_u8 *)((long)&(puVar4->m_color).field_0 + lVar13),-0.5,
                     (int)puVar4 + uVar5 * 8);
          if ((this->m_temp_unique_colors).m_capacity <= uVar9) {
            uVar9 = uVar3 + 2;
            a = (unique_color *)(ulong)uVar9;
            elemental_vector::increase_capacity
                      ((elemental_vector *)local_40,uVar9,true,8,(object_mover)0x0,false);
          }
          puVar4 = (this->m_temp_unique_colors).m_p;
          uVar9 = (this->m_temp_unique_colors).m_size;
          puVar4[uVar9].m_color.field_0.field_0.r = local_48;
          puVar4[uVar9].m_color.field_0.field_0.g = uStack_47;
          puVar4[uVar9].m_color.field_0.field_0.b = local_46;
          puVar4[uVar9].m_color.field_0.field_0.a = uStack_45;
          puVar4[uVar9].m_weight = local_44;
          uVar3 = (this->m_temp_unique_colors).m_size;
          uVar9 = uVar3 + 1;
          (this->m_temp_unique_colors).m_size = uVar9;
          puVar4 = (this->m_temp_unique_colors).m_p;
          lerp_color((dxt1_endpoint_optimizer *)&stack0xffffffffffffffb8,&a->m_color,
                     (color_quad_u8 *)((long)&(puVar4->m_color).field_0 + lVar13),0.5,
                     (int)puVar4 + uVar5 * 8);
          if ((this->m_temp_unique_colors).m_capacity <= uVar9) {
            uVar9 = uVar3 + 2;
            a = (unique_color *)(ulong)uVar9;
            elemental_vector::increase_capacity
                      ((elemental_vector *)local_40,uVar9,true,8,(object_mover)0x0,false);
          }
          puVar4 = (this->m_temp_unique_colors).m_p;
          uVar9 = (this->m_temp_unique_colors).m_size;
          puVar4[uVar9].m_color.field_0.field_0.r = local_48;
          puVar4[uVar9].m_color.field_0.field_0.g = uStack_47;
          puVar4[uVar9].m_color.field_0.field_0.b = local_46;
          puVar4[uVar9].m_color.field_0.field_0.a = uStack_45;
          puVar4[uVar9].m_weight = local_44;
          uVar3 = (this->m_temp_unique_colors).m_size;
          uVar9 = uVar3 + 1;
          (this->m_temp_unique_colors).m_size = uVar9;
          puVar4 = (this->m_temp_unique_colors).m_p;
          lerp_color((dxt1_endpoint_optimizer *)&stack0xffffffffffffffb8,&a->m_color,
                     (color_quad_u8 *)((long)&(puVar4->m_color).field_0 + lVar13),-2.0,
                     (int)puVar4 + uVar5 * 8);
          if ((this->m_temp_unique_colors).m_capacity <= uVar9) {
            uVar9 = uVar3 + 2;
            a = (unique_color *)(ulong)uVar9;
            elemental_vector::increase_capacity
                      ((elemental_vector *)local_40,uVar9,true,8,(object_mover)0x0,false);
          }
          puVar4 = (this->m_temp_unique_colors).m_p;
          uVar9 = (this->m_temp_unique_colors).m_size;
          puVar4[uVar9].m_color.field_0.field_0.r = local_48;
          puVar4[uVar9].m_color.field_0.field_0.g = uStack_47;
          puVar4[uVar9].m_color.field_0.field_0.b = local_46;
          puVar4[uVar9].m_color.field_0.field_0.a = uStack_45;
          puVar4[uVar9].m_weight = local_44;
          uVar3 = (this->m_temp_unique_colors).m_size;
          uVar9 = uVar3 + 1;
          (this->m_temp_unique_colors).m_size = uVar9;
          puVar4 = (this->m_temp_unique_colors).m_p;
          lerp_color((dxt1_endpoint_optimizer *)&stack0xffffffffffffffb8,&a->m_color,
                     (color_quad_u8 *)((long)&(puVar4->m_color).field_0 + lVar13),-1.0,
                     (int)puVar4 + uVar5 * 8);
          prVar7 = local_40;
          if ((this->m_temp_unique_colors).m_capacity <= uVar9) {
            uVar9 = uVar3 + 2;
            a = (unique_color *)(ulong)uVar9;
            elemental_vector::increase_capacity
                      ((elemental_vector *)local_40,uVar9,true,8,(object_mover)0x0,false);
          }
          puVar4 = (this->m_temp_unique_colors).m_p;
          uVar9 = (this->m_temp_unique_colors).m_size;
          puVar4[uVar9].m_color.field_0.field_0.r = local_48;
          puVar4[uVar9].m_color.field_0.field_0.g = uStack_47;
          puVar4[uVar9].m_color.field_0.field_0.b = local_46;
          puVar4[uVar9].m_color.field_0.field_0.a = uStack_45;
          puVar4[uVar9].m_weight = local_44;
          puVar1 = &(this->m_temp_unique_colors).m_size;
          *puVar1 = *puVar1 + 1;
          lVar15 = local_38 + 1;
          lVar13 = lVar13 + 8;
        } while (lVar15 == 1);
        bVar16 = iVar10 == 0;
        iVar10 = iVar10 + 1;
      } while (bVar16);
    }
    else if (uVar3 == 3) {
      lVar15 = 0;
      lVar13 = 0;
      do {
        lVar8 = 0;
        do {
          if (lVar15 != lVar8) {
            puVar4 = (this->m_temp_unique_colors).m_p;
            iVar10 = (int)lVar8;
            lerp_color((dxt1_endpoint_optimizer *)&stack0xffffffffffffffb8,&a->m_color,
                       &puVar4[lVar13].m_color,1.5,(int)puVar4 + iVar10);
            uVar9 = (this->m_temp_unique_colors).m_size;
            a = (unique_color *)(ulong)uVar9;
            if ((this->m_temp_unique_colors).m_capacity <= uVar9) {
              a = (unique_color *)(ulong)(uVar9 + 1);
              elemental_vector::increase_capacity
                        ((elemental_vector *)prVar7,uVar9 + 1,true,8,(object_mover)0x0,false);
            }
            puVar4 = (this->m_temp_unique_colors).m_p;
            uVar9 = (this->m_temp_unique_colors).m_size;
            puVar4[uVar9].m_color.field_0.field_0.r = local_48;
            puVar4[uVar9].m_color.field_0.field_0.g = uStack_47;
            puVar4[uVar9].m_color.field_0.field_0.b = local_46;
            puVar4[uVar9].m_color.field_0.field_0.a = uStack_45;
            puVar4[uVar9].m_weight = local_44;
            uVar3 = (this->m_temp_unique_colors).m_size;
            uVar9 = uVar3 + 1;
            (this->m_temp_unique_colors).m_size = uVar9;
            puVar4 = (this->m_temp_unique_colors).m_p;
            lerp_color((dxt1_endpoint_optimizer *)&stack0xffffffffffffffb8,&a->m_color,
                       &puVar4[lVar13].m_color,0.6666667,(int)puVar4 + iVar10);
            if ((this->m_temp_unique_colors).m_capacity <= uVar9) {
              uVar9 = uVar3 + 2;
              a = (unique_color *)(ulong)uVar9;
              elemental_vector::increase_capacity
                        ((elemental_vector *)local_40,uVar9,true,8,(object_mover)0x0,false);
            }
            puVar4 = (this->m_temp_unique_colors).m_p;
            uVar9 = (this->m_temp_unique_colors).m_size;
            puVar4[uVar9].m_color.field_0.field_0.r = local_48;
            puVar4[uVar9].m_color.field_0.field_0.g = uStack_47;
            puVar4[uVar9].m_color.field_0.field_0.b = local_46;
            puVar4[uVar9].m_color.field_0.field_0.a = uStack_45;
            puVar4[uVar9].m_weight = local_44;
            uVar3 = (this->m_temp_unique_colors).m_size;
            uVar9 = uVar3 + 1;
            (this->m_temp_unique_colors).m_size = uVar9;
            puVar4 = (this->m_temp_unique_colors).m_p;
            lerp_color((dxt1_endpoint_optimizer *)&stack0xffffffffffffffb8,&a->m_color,
                       &puVar4[lVar13].m_color,0.33333334,(int)puVar4 + iVar10);
            if ((this->m_temp_unique_colors).m_capacity <= uVar9) {
              uVar9 = uVar3 + 2;
              a = (unique_color *)(ulong)uVar9;
              elemental_vector::increase_capacity
                        ((elemental_vector *)local_40,uVar9,true,8,(object_mover)0x0,false);
            }
            puVar4 = (this->m_temp_unique_colors).m_p;
            uVar9 = (this->m_temp_unique_colors).m_size;
            puVar4[uVar9].m_color.field_0.field_0.r = local_48;
            puVar4[uVar9].m_color.field_0.field_0.g = uStack_47;
            puVar4[uVar9].m_color.field_0.field_0.b = local_46;
            puVar4[uVar9].m_color.field_0.field_0.a = uStack_45;
            puVar4[uVar9].m_weight = local_44;
            uVar3 = (this->m_temp_unique_colors).m_size;
            uVar9 = uVar3 + 1;
            (this->m_temp_unique_colors).m_size = uVar9;
            puVar4 = (this->m_temp_unique_colors).m_p;
            lerp_color((dxt1_endpoint_optimizer *)&stack0xffffffffffffffb8,&a->m_color,
                       &puVar4[lVar13].m_color,-0.5,(int)puVar4 + iVar10);
            prVar7 = local_40;
            if ((this->m_temp_unique_colors).m_capacity <= uVar9) {
              uVar9 = uVar3 + 2;
              a = (unique_color *)(ulong)uVar9;
              elemental_vector::increase_capacity
                        ((elemental_vector *)local_40,uVar9,true,8,(object_mover)0x0,false);
            }
            puVar4 = (this->m_temp_unique_colors).m_p;
            uVar9 = (this->m_temp_unique_colors).m_size;
            puVar4[uVar9].m_color.field_0.field_0.r = local_48;
            puVar4[uVar9].m_color.field_0.field_0.g = uStack_47;
            puVar4[uVar9].m_color.field_0.field_0.b = local_46;
            puVar4[uVar9].m_color.field_0.field_0.a = uStack_45;
            puVar4[uVar9].m_weight = local_44;
            puVar1 = &(this->m_temp_unique_colors).m_size;
            *puVar1 = *puVar1 + 1;
          }
          lVar8 = lVar8 + 8;
        } while (lVar8 != 0x18);
        lVar13 = lVar13 + 1;
        lVar15 = lVar15 + 8;
      } while (lVar13 != 3);
    }
    if ((this->m_unique_packed_colors).m_size != 0) {
      (this->m_unique_packed_colors).m_size = 0;
    }
    if ((this->m_temp_unique_colors).m_size != 0) {
      lVar13 = 0;
      uVar14 = 0;
      do {
        _local_48 = dxt1_block::pack_color
                              ((color_quad_u8 *)
                               ((long)&(((this->m_temp_unique_colors).m_p)->m_color).field_0 +
                               lVar13),true,0x7f);
        puVar6 = (this->m_unique_packed_colors).m_p;
        puVar6 = std::
                 __find_if<unsigned_short*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_short_const>>
                           (puVar6,puVar6 + (this->m_unique_packed_colors).m_size,
                            &stack0xffffffffffffffb8);
        uVar9 = (this->m_unique_packed_colors).m_size;
        if (puVar6 == (this->m_unique_packed_colors).m_p + uVar9) {
          if ((this->m_unique_packed_colors).m_capacity <= uVar9) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&this->m_unique_packed_colors,uVar9 + 1,true,2,
                       (object_mover)0x0,false);
          }
          (this->m_unique_packed_colors).m_p[(this->m_unique_packed_colors).m_size] = _local_48;
          puVar1 = &(this->m_unique_packed_colors).m_size;
          *puVar1 = *puVar1 + 1;
        }
        uVar14 = uVar14 + 1;
        lVar13 = lVar13 + 8;
      } while (uVar14 < (this->m_temp_unique_colors).m_size);
    }
    prVar7 = (results *)(this->m_best_solution).m_error;
    bVar16 = prVar7 == (results *)0x0;
    if (!bVar16) {
      if ((this->m_unique_packed_colors).m_size != 1) {
        uVar11 = 2;
        uVar14 = 0;
        do {
          uVar2 = uVar14 + 1;
          if (((this->m_best_solution).m_error != 0) &&
             (uVar12 = uVar11, uVar2 < (this->m_unique_packed_colors).m_size)) {
            do {
              puVar6 = (this->m_unique_packed_colors).m_p;
              _local_48 = puVar6[uVar14];
              _local_46 = puVar6[uVar12 - 1];
              evaluate_solution(this,(dxt1_solution_coordinates *)&stack0xffffffffffffffb8,false);
              if ((this->m_best_solution).m_error == 0) break;
              bVar16 = uVar12 < (this->m_unique_packed_colors).m_size;
              uVar12 = uVar12 + 1;
            } while (bVar16);
          }
          prVar7 = (results *)(this->m_best_solution).m_error;
          bVar16 = prVar7 == (results *)0x0;
          if (bVar16) goto LAB_0016ea24;
          uVar11 = uVar11 + 1;
          uVar14 = uVar2;
        } while (uVar2 < (this->m_unique_packed_colors).m_size - 1);
      }
      if (!bVar16) {
        (this->m_best_solution).m_error = 1;
      }
    }
LAB_0016ea24:
    local_40 = prVar7;
    bVar16 = (this->m_best_solution).m_error == 0;
    if (!bVar16) {
      if ((this->m_unique_packed_colors).m_size != 1) {
        uVar11 = 2;
        uVar14 = 0;
        do {
          uVar2 = uVar14 + 1;
          if (((this->m_best_solution).m_error != 0) &&
             (uVar12 = uVar11, uVar2 < (this->m_unique_packed_colors).m_size)) {
            do {
              puVar6 = (this->m_unique_packed_colors).m_p;
              _local_48 = puVar6[uVar14];
              _local_46 = puVar6[uVar12 - 1];
              evaluate_solution(this,(dxt1_solution_coordinates *)&stack0xffffffffffffffb8,true);
              if ((this->m_best_solution).m_error == 0) break;
              bVar16 = uVar12 < (this->m_unique_packed_colors).m_size;
              uVar12 = uVar12 + 1;
            } while (bVar16);
          }
          bVar16 = (this->m_best_solution).m_error == 0;
          if (bVar16) {
            return;
          }
          uVar11 = uVar11 + 1;
          uVar14 = uVar2;
        } while (uVar2 < (this->m_unique_packed_colors).m_size - 1);
      }
      if (!bVar16) {
        (this->m_best_solution).m_error = (uint64)local_40;
      }
    }
  }
  return;
}

Assistant:

inline uint size() const
        {
            return m_size;
        }